

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.h
# Opt level: O0

void get_eobx_eoby_scan_h_identity(int *eobx,int *eoby,TX_SIZE tx_size,int eob)

{
  int iVar1;
  int local_2c;
  int local_28;
  int temp_eoby;
  int eobx_max;
  int txfm_size_col;
  int eob_local;
  TX_SIZE tx_size_local;
  int *eoby_local;
  int *eobx_local;
  
  iVar1 = eob + -1;
  local_28 = tx_size_wide[tx_size];
  if (0x20 < local_28) {
    local_28 = 0x20;
  }
  local_2c = local_28 + -1;
  if (iVar1 < local_2c) {
    local_2c = eob_fill[iVar1];
  }
  *eobx = local_2c;
  *eoby = eob_fill[iVar1 / local_28];
  return;
}

Assistant:

static inline void get_eobx_eoby_scan_h_identity(int *eobx, int *eoby,
                                                 TX_SIZE tx_size, int eob) {
  eob -= 1;
  const int txfm_size_col = tx_size_wide[tx_size];
  const int eobx_max = AOMMIN(32, txfm_size_col) - 1;
  *eobx = (eob >= eobx_max) ? eobx_max : eob_fill[eob];
  const int temp_eoby = eob / (eobx_max + 1);
  assert(temp_eoby < 32);
  *eoby = eob_fill[temp_eoby];
}